

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

void __thiscall
array<CSkins::CSkin,_allocator_default<CSkins::CSkin>_>::clear
          (array<CSkins::CSkin,_allocator_default<CSkins::CSkin>_> *this)

{
  CSkin *pCVar1;
  
  if (this->list != (CSkin *)0x0) {
    operator_delete__(this->list);
  }
  this->list_size = 1;
  pCVar1 = (CSkin *)operator_new__(200);
  this->list = pCVar1;
  this->num_elements = 0;
  return;
}

Assistant:

void clear()
	{
		ALLOCATOR::free_array(list);
		list_size = 1;
		list = ALLOCATOR::alloc_array(list_size);
		num_elements = 0;
	}